

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::LowerInclusiveBetweenOperator,false>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  unsigned_long *puVar11;
  unsigned_long *puVar12;
  unsigned_long *puVar13;
  sel_t *psVar14;
  sel_t *psVar15;
  long lVar16;
  long lVar17;
  idx_t iVar18;
  ulong uVar19;
  bool bVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  idx_t iVar25;
  ulong uVar26;
  idx_t iVar27;
  ulong uVar28;
  idx_t iVar29;
  idx_t iVar30;
  idx_t iVar31;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar23 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar14 = false_sel->sel_vector;
        lVar23 = 0;
        uVar22 = 0;
        do {
          uVar26 = uVar22;
          if (psVar7 != (sel_t *)0x0) {
            uVar26 = (ulong)psVar7[uVar22];
          }
          uVar21 = uVar22;
          if (psVar8 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar8[uVar22];
          }
          uVar24 = uVar22;
          if (psVar9 != (sel_t *)0x0) {
            uVar24 = (ulong)psVar9[uVar22];
          }
          uVar28 = uVar22;
          if (psVar10 != (sel_t *)0x0) {
            uVar28 = (ulong)psVar10[uVar22];
          }
          if ((((puVar11 == (unsigned_long *)0x0) ||
               ((puVar11[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) &&
              ((puVar12 == (unsigned_long *)0x0 ||
               ((puVar12[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)))) &&
             ((puVar13 == (unsigned_long *)0x0 ||
              ((puVar13[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)))) {
            lVar16 = *(long *)(pdVar2 + uVar21 * 0x10 + 8);
            uVar19 = 1;
            if ((*(long *)(pdVar4 + uVar24 * 0x10 + 8) <= lVar16) &&
               (*(ulong *)(pdVar4 + uVar24 * 0x10) <= *(ulong *)(pdVar2 + uVar21 * 0x10) ||
                *(long *)(pdVar4 + uVar24 * 0x10 + 8) != lVar16)) {
              uVar19 = (ulong)((*(ulong *)(pdVar6 + uVar28 * 0x10) <=
                                *(ulong *)(pdVar2 + uVar21 * 0x10) ||
                               *(long *)(pdVar6 + uVar28 * 0x10 + 8) != lVar16) &&
                              *(long *)(pdVar6 + uVar28 * 0x10 + 8) <= lVar16);
            }
          }
          else {
            uVar19 = 1;
          }
          psVar14[lVar23] = (sel_t)uVar26;
          lVar23 = lVar23 + uVar19;
          uVar22 = uVar22 + 1;
        } while (count != uVar22);
      }
      return count - lVar23;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar14 = true_sel->sel_vector;
      iVar18 = 0;
      iVar30 = 0;
      do {
        iVar27 = iVar30;
        if (psVar7 != (sel_t *)0x0) {
          iVar27 = (idx_t)psVar7[iVar30];
        }
        iVar25 = iVar30;
        if (psVar8 != (sel_t *)0x0) {
          iVar25 = (idx_t)psVar8[iVar30];
        }
        iVar31 = iVar30;
        if (psVar9 != (sel_t *)0x0) {
          iVar31 = (idx_t)psVar9[iVar30];
        }
        iVar29 = iVar30;
        if (psVar10 != (sel_t *)0x0) {
          iVar29 = (idx_t)psVar10[iVar30];
        }
        if ((((puVar11 == (unsigned_long *)0x0) ||
             ((puVar11[iVar25 >> 6] >> (iVar25 & 0x3f) & 1) != 0)) &&
            ((puVar12 == (unsigned_long *)0x0 ||
             ((puVar12[iVar31 >> 6] >> (iVar31 & 0x3f) & 1) != 0)))) &&
           ((puVar13 == (unsigned_long *)0x0 || ((puVar13[iVar29 >> 6] >> (iVar29 & 0x3f) & 1) != 0)
            ))) {
          lVar23 = *(long *)(pdVar2 + iVar25 * 0x10 + 8);
          if (lVar23 < *(long *)(pdVar4 + iVar31 * 0x10 + 8)) {
            uVar22 = 0;
          }
          else {
            uVar22 = 0;
            if (*(ulong *)(pdVar4 + iVar31 * 0x10) <= *(ulong *)(pdVar2 + iVar25 * 0x10) ||
                *(long *)(pdVar4 + iVar31 * 0x10 + 8) != lVar23) {
              lVar16 = *(long *)(pdVar6 + iVar29 * 0x10 + 8);
              uVar22 = (ulong)(*(ulong *)(pdVar2 + iVar25 * 0x10) <
                               *(ulong *)(pdVar6 + iVar29 * 0x10) && lVar16 == lVar23 ||
                              lVar16 != lVar23 && lVar23 <= lVar16);
            }
          }
        }
        else {
          uVar22 = 0;
        }
        psVar14[iVar18] = (sel_t)iVar27;
        iVar18 = iVar18 + uVar22;
        iVar30 = iVar30 + 1;
      } while (count != iVar30);
      return iVar18;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    puVar11 = (adata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar12 = (bdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    puVar13 = (cdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar14 = true_sel->sel_vector;
    psVar15 = false_sel->sel_vector;
    iVar18 = 0;
    lVar23 = 0;
    uVar22 = 0;
    do {
      uVar26 = uVar22;
      if (psVar7 != (sel_t *)0x0) {
        uVar26 = (ulong)psVar7[uVar22];
      }
      uVar21 = uVar22;
      if (psVar8 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar8[uVar22];
      }
      uVar24 = uVar22;
      if (psVar9 != (sel_t *)0x0) {
        uVar24 = (ulong)psVar9[uVar22];
      }
      uVar28 = uVar22;
      if (psVar10 != (sel_t *)0x0) {
        uVar28 = (ulong)psVar10[uVar22];
      }
      if ((((puVar11 == (unsigned_long *)0x0) ||
           ((puVar11[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) &&
          ((puVar12 == (unsigned_long *)0x0 || ((puVar12[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0))
          )) && ((puVar13 == (unsigned_long *)0x0 ||
                 ((puVar13[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)))) {
        lVar16 = *(long *)(pdVar2 + uVar21 * 0x10 + 8);
        bVar20 = false;
        if ((*(long *)(pdVar4 + uVar24 * 0x10 + 8) <= lVar16) &&
           (bVar20 = false,
           *(ulong *)(pdVar4 + uVar24 * 0x10) <= *(ulong *)(pdVar2 + uVar21 * 0x10) ||
           *(long *)(pdVar4 + uVar24 * 0x10 + 8) != lVar16)) {
          lVar17 = *(long *)(pdVar6 + uVar28 * 0x10 + 8);
          bVar20 = *(ulong *)(pdVar2 + uVar21 * 0x10) < *(ulong *)(pdVar6 + uVar28 * 0x10) &&
                   lVar17 == lVar16 || lVar17 != lVar16 && lVar16 <= lVar17;
        }
      }
      else {
        bVar20 = false;
      }
      psVar14[iVar18] = (sel_t)uVar26;
      iVar18 = iVar18 + bVar20;
      psVar15[lVar23] = (sel_t)uVar26;
      lVar23 = lVar23 + (ulong)(bVar20 ^ 1);
      uVar22 = uVar22 + 1;
    } while (count != uVar22);
    return iVar18;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}